

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

void __thiscall
mjs::string_object::do_debug_print_extra
          (string_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  gc_string *pgVar2;
  wstring_view *s;
  wstring local_70;
  wchar_t *local_50;
  long local_48;
  long local_40 [2];
  ulong local_30;
  gc_string *local_28;
  
  local_50 = (wchar_t *)local_40;
  std::__cxx11::wstring::_M_construct((ulong)&local_50,indent);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_50,local_48);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: \"");
  pgVar2 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                     ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)
                      &(this->super_native_object).field_0x24,
                      (this->super_native_object).super_object.heap_);
  local_28 = pgVar2 + 1;
  local_30 = (ulong)pgVar2->length_;
  cpp_quote_abi_cxx11_(&local_70,(mjs *)&local_30,s);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::operator<<(pwVar1,"\"\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_50 != (wchar_t *)local_40) {
    operator_delete(local_50,local_40[0] * 4 + 4);
  }
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: \"" << cpp_quote(view()) << "\"\n";
    }